

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall geometry::Group::add_child(Group *this,Primitive *object)

{
  BoundingBox local_58;
  Primitive *local_18;
  Primitive *object_local;
  Group *this_local;
  
  object->parent = this;
  local_18 = object;
  object_local = &this->super_Primitive;
  primitive::Primitive::bounds(&local_58,object);
  core::BoundingBox::add_bounds(&this->m_bounds,&local_58);
  std::vector<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>::
  push_back(&this->m_children,&local_18);
  return;
}

Assistant:

void geometry::Group::add_child(geometry::primitive::Primitive *object)
{
    object->parent = this;
    m_bounds.add_bounds(object->bounds());
    m_children.push_back(object);
}